

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O3

void Map_CutsCollect_rec(Map_Cut_t *pCut,Map_NodeVec_t *vVisited)

{
  if (pCut->fMark != '\0') {
    return;
  }
  Map_CutsCollect_rec((Map_Cut_t *)((ulong)pCut->pOne & 0xfffffffffffffffe),vVisited);
  Map_CutsCollect_rec((Map_Cut_t *)((ulong)pCut->pTwo & 0xfffffffffffffffe),vVisited);
  if (pCut->fMark == '\0') {
    pCut->fMark = '\x01';
    Map_NodeVecPush(vVisited,(Map_Node_t *)pCut);
    return;
  }
  __assert_fail("pCut->fMark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperTruth.c"
                ,0x11c,"void Map_CutsCollect_rec(Map_Cut_t *, Map_NodeVec_t *)");
}

Assistant:

void Map_CutsCollect_rec( Map_Cut_t * pCut, Map_NodeVec_t * vVisited )
{
    if ( pCut->fMark )
        return;
    Map_CutsCollect_rec( Map_CutRegular(pCut->pOne), vVisited );
    Map_CutsCollect_rec( Map_CutRegular(pCut->pTwo), vVisited );
    assert( pCut->fMark == 0 );
    pCut->fMark = 1;
    Map_NodeVecPush( vVisited, (Map_Node_t *)pCut );
}